

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::writeHintStream(QPDFWriter *this,int hint_id)

{
  QPDF *qpdf;
  element_type *peVar1;
  element_type *peVar2;
  ulong uVar3;
  char *pcVar4;
  char local_1b9;
  byte local_199;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  undefined1 local_168 [8];
  PipelinePopper pp_enc;
  undefined1 auStack_150 [7];
  char last_char;
  string local_140;
  string_view local_120;
  string_view local_110;
  string local_100;
  string_view local_e0;
  string_view local_d0;
  string local_c0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  unsigned_long local_60;
  size_t hlen;
  byte local_41;
  int local_40;
  int iStack_3c;
  bool compressed;
  int O;
  int S;
  string hint_buffer;
  int hint_id_local;
  QPDFWriter *this_local;
  
  hint_buffer.field_2._12_4_ = hint_id;
  std::__cxx11::string::string((string *)&O);
  iStack_3c = 0;
  local_40 = 0;
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_199 = 0;
  if ((peVar1->compress_streams & 1U) != 0) {
    peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_199 = peVar1->qdf_mode ^ 0xff;
  }
  local_41 = local_199 & 1;
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  qpdf = peVar1->pdf;
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  QPDF::Writer::generateHintStream
            (qpdf,&peVar1->new_obj,&peVar2->obj,(string *)&O,&stack0xffffffffffffffc4,&local_40,
             (bool)(local_41 & 1));
  openObject(this,hint_buffer.field_2._12_4_);
  setDataKey(this,hint_buffer.field_2._12_4_);
  local_60 = std::__cxx11::string::size();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"<< ");
  writeString(this,local_70);
  if ((local_41 & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"/Filter /FlateDecode ");
    writeString(this,local_80);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"/S ");
  writeString(this,local_90);
  std::__cxx11::to_string(&local_c0,iStack_3c);
  local_a0 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c0);
  writeString(this,local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (local_40 != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0," /O ");
    writeString(this,local_d0);
    std::__cxx11::to_string(&local_100,local_40);
    local_e0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_100);
    writeString(this,local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110," /Length ");
  writeString(this,local_110);
  adjustAESStreamLength(this,&local_60);
  std::__cxx11::to_string(&local_140,local_60);
  local_120 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_140);
  writeString(this,local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_150," >>\nstream\n");
  writeString(this,_auStack_150);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar1->encrypted & 1U) != 0) {
    QTC::TC("qpdf","QPDFWriter encrypted hint stream",0);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::back();
    local_1b9 = *pcVar4;
  }
  else {
    local_1b9 = '\0';
  }
  pp_enc.stack_id._7_1_ = local_1b9;
  PipelinePopper::PipelinePopper((PipelinePopper *)local_168,this);
  pushEncryptionFilter(this,(PipelinePopper *)local_168);
  local_178 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&O);
  writeString(this,local_178);
  PipelinePopper::~PipelinePopper((PipelinePopper *)local_168);
  if (pp_enc.stack_id._7_1_ != '\n') {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"\n");
    writeString(this,local_188);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"endstream");
  writeString(this,local_198);
  closeObject(this,hint_buffer.field_2._12_4_);
  std::__cxx11::string::~string((string *)&O);
  return;
}

Assistant:

void
QPDFWriter::writeHintStream(int hint_id)
{
    std::string hint_buffer;
    int S = 0;
    int O = 0;
    bool compressed = (m->compress_streams && !m->qdf_mode);
    QPDF::Writer::generateHintStream(m->pdf, m->new_obj, m->obj, hint_buffer, S, O, compressed);

    openObject(hint_id);
    setDataKey(hint_id);

    size_t hlen = hint_buffer.size();

    writeString("<< ");
    if (compressed) {
        writeString("/Filter /FlateDecode ");
    }
    writeString("/S ");
    writeString(std::to_string(S));
    if (O) {
        writeString(" /O ");
        writeString(std::to_string(O));
    }
    writeString(" /Length ");
    adjustAESStreamLength(hlen);
    writeString(std::to_string(hlen));
    writeString(" >>\nstream\n");

    if (m->encrypted) {
        QTC::TC("qpdf", "QPDFWriter encrypted hint stream");
    }
    char last_char = hint_buffer.empty() ? '\0' : hint_buffer.back();
    {
        PipelinePopper pp_enc(this);
        pushEncryptionFilter(pp_enc);
        writeString(hint_buffer);
    }

    if (last_char != '\n') {
        writeString("\n");
    }
    writeString("endstream");
    closeObject(hint_id);
}